

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O3

void __thiscall
trompeloeil::call_matcher<bool(int),std::tuple<trompeloeil::wildcard>>::
set_sequence<std::pair<char_const*,trompeloeil::sequence&>>
          (call_matcher<bool(int),std::tuple<trompeloeil::wildcard>> *this,
          pair<const_char_*,_trompeloeil::sequence_&> *t)

{
  long lVar1;
  char *exp;
  long *plVar2;
  location loc;
  size_t sVar3;
  init_type i;
  sequence_handler_base *handler;
  
  lVar1 = *(long *)(this + 0x70);
  handler = (sequence_handler_base *)operator_new(0x68);
  exp = *(char **)(this + 0x28);
  loc = *(location *)(this + 0x18);
  sVar3 = *(size_t *)(lVar1 + 0x10);
  handler->min_calls = *(size_t *)(lVar1 + 8);
  handler->max_calls = sVar3;
  handler->call_count = *(size_t *)(lVar1 + 0x18);
  handler->_vptr_sequence_handler_base = (_func_int **)&PTR__sequence_handler_004f23e8;
  i.first = t->first;
  i.second = t->second;
  sequence_matcher::sequence_matcher((sequence_matcher *)(handler + 1),exp,loc,handler,i);
  plVar2 = *(long **)(this + 0x70);
  *(sequence_handler_base **)(this + 0x70) = handler;
  if (plVar2 != (long *)0x0) {
    (**(code **)(*plVar2 + 8))();
    return;
  }
  return;
}

Assistant:

void
    set_sequence(
      T&& ... t)
    {
      using handler = sequence_handler<sizeof...(T)>;
      auto seq = detail::make_unique<handler>(*sequences,
                                              name,
                                              loc,
                                              std::forward<T>(t)...);
      sequences = std::move(seq);
    }